

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  TestError *this_00;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  string function_use;
  string iteration_loop_start;
  string iteration_loop_end;
  string verification;
  string function_definition;
  string multiplier_array;
  long *local_180;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::ES> *local_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  TestShaderType local_d4;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8[0] = local_e8;
  local_120 = this;
  local_d4 = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,"");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,"");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "const int[] multiplier_array = int[]( 1,  2,  3,  4,  5,  6,  7,  8,\n                                     11, 12, 13, 14, 15, 16, 17, 18,\n                                     21, 22, 23, 24, 25, 26, 27, 28,\n                                     31, 32, 33, 34, 35, 36, 37, 38,\n                                     41, 42, 43, 44, 45, 46, 47, 48,\n                                     51, 52, 53, 54, 55, 56, 57, 58,\n                                     61, 62, 63, 64, 65, 66, 67, 68,\n                                     71, 72, 73, 74, 75, 76, 77, 78,\n                                     81, 82, 83, 84, 85, 86, 87, 88);\n"
             ,"");
  paVar1 = &local_160.field_2;
  lVar7 = 0;
  do {
    lVar2 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar2 = 0x2238c78;
      lVar3 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_es[lVar7] <= *(int *)(lVar3 + 0x20)) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 +
                         (ulong)(*(int *)(lVar3 + 0x20) <
                                (int)test_shader_compilation::var_types_set_es[lVar7]) * 8);
      } while (lVar3 != 0);
    }
    lVar3 = 0x2238c78;
    if ((lVar2 != 0x2238c78) &&
       (lVar3 = lVar2,
       (int)test_shader_compilation::var_types_set_es[lVar7] < *(int *)(lVar2 + 0x20))) {
      lVar3 = 0x2238c78;
    }
    if (lVar3 == 0x2238c78) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x14c3);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70[0]);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)&local_90,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_118[0]);
    std::operator+(&local_160,
                   "                                   inout_array[a][b][c][d][e][f][g][h] *= ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar3 + 200));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_180 = &local_170;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_170 = *plVar5;
      lStack_168 = plVar4[3];
    }
    else {
      local_170 = *plVar5;
      local_180 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f8[0]);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::append((char *)&local_140);
    std::__cxx11::string::append((char *)&local_140);
    std::operator+(&local_160,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar3 + 0x28));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_180 = &local_170;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_170 = *plVar5;
      lStack_168 = plVar4[3];
    }
    else {
      local_170 = *plVar5;
      local_180 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_118[0]);
    std::operator+(&local_160,
                   "                                   my_array[a][b][c][d][e][f][g][h] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar3 + 0x128));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_180 = &local_170;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_170 = *plVar5;
      lStack_168 = plVar4[3];
    }
    else {
      local_170 = *plVar5;
      local_180 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_f8[0]);
    std::__cxx11::string::append((char *)&local_140);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_118[0]);
    std::operator+(&local_50,
                   "                                   if (my_array[a][b][c][d][e][f][g][h] ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar3 + 0xe8));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = &local_a0;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar4[3];
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,*(ulong *)(lVar3 + 200));
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_160.field_2._M_allocated_capacity = *psVar6;
      local_160.field_2._8_8_ = plVar4[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar6;
      local_160._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_160._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_180 = &local_170;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_170 = *plVar5;
      lStack_168 = plVar4[3];
    }
    else {
      local_170 = *plVar5;
      local_180 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f8[0]);
    if (local_d4 == COMPUTE_SHADER_TYPE) {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::execute_dispatch_test
                (&local_120->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>,
                 COMPUTE_SHADER_TYPE,&local_90,&local_140,&local_d0);
    }
    else {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::execute_draw_test
                (&local_120->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>,
                 local_d4,&local_90,&local_140,&local_d0);
    }
    (*(local_120->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xb);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  return;
}

Assistant:

void InteractionFunctionCalls2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const std::string multiplier_array = "const int[] multiplier_array = int[]( 1,  2,  3,  4,  5,  6,  7,  8,\n"
										 "                                     11, 12, 13, 14, 15, 16, 17, 18,\n"
										 "                                     21, 22, 23, 24, 25, 26, 27, 28,\n"
										 "                                     31, 32, 33, 34, 35, 36, 37, 38,\n"
										 "                                     41, 42, 43, 44, 45, 46, 47, 48,\n"
										 "                                     51, 52, 53, 54, 55, 56, 57, 58,\n"
										 "                                     61, 62, 63, 64, 65, 66, 67, 68,\n"
										 "                                     71, 72, 73, 74, 75, 76, 77, 78,\n"
										 "                                     81, 82, 83, 84, 85, 86, 87, 88);\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += multiplier_array;
			function_definition += "void my_function(inout ";
			function_definition += var_iterator->second.type;
			function_definition += " inout_array[2][2][2][2][2][2][2][2]) {\n"
								   "    uint i = 0u;\n";
			function_definition += iteration_loop_start;
			function_definition += "                                   inout_array[a][b][c][d][e][f][g][h] *= " +
								   var_iterator->second.iterator_type + "(multiplier_array[i % 64u]);\n";
			function_definition += "                                   i+= 1u;\n";
			function_definition += iteration_loop_end;
			function_definition += "}";

			function_use += "    float result = 1.0;\n";
			function_use += "    uint iterator = 0u;\n";
			function_use += "    " + var_iterator->second.type + " my_array[2][2][2][2][2][2][2][2];\n";
			function_use += iteration_loop_start;
			function_use += "                                   my_array[a][b][c][d][e][f][g][h] = " +
							var_iterator->second.variable_type_initializer2 + ";\n";
			function_use += iteration_loop_end;
			function_use += "    my_function(my_array);";

			verification += iteration_loop_start;
			verification += "                                   if (my_array[a][b][c][d][e][f][g][h] " +
							var_iterator->second.specific_element + "!= " + var_iterator->second.iterator_type +
							"(multiplier_array[iterator % 64u]))\n"
							"                                   {\n"
							"                                       result = 0.0;\n"
							"                                   }\n"
							"                                   iterator += 1u;\n";
			verification += iteration_loop_end;

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}